

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::MergeFrom(DynamicMapField *this,MapFieldBase *other)

{
  bool value;
  int iVar1;
  int iVar2;
  CppType CVar3;
  int32 value_00;
  uint32 value_01;
  undefined4 extraout_var;
  MapValueRef *map_val;
  undefined4 extraout_var_00;
  FieldDescriptor *this_00;
  Message *pMVar4;
  Message *pMVar5;
  uint64 value_02;
  int64 value_03;
  string *value_04;
  float value_05;
  double value_06;
  const_iterator other_it;
  iterator iter;
  allocator local_89;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_88;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *local_70;
  iterator local_68;
  string local_50;
  
  iVar1 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x14])();
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((const_iterator *)&local_88,
             (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)(other + 1));
  local_70 = &this->map_;
  while (local_88.node_ != (Node *)0x0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
              (&local_68,
               (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               CONCAT44(extraout_var,iVar1),&(((local_88.node_)->kv).v_)->first);
    if (local_68.it_.node_ == (Node *)0x0) {
      map_val = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                          (local_70,&(((local_88.node_)->kv).v_)->first);
      AllocateMapValue(this,map_val);
    }
    else {
      map_val = &(((local_68.it_.node_)->kv).v_)->second;
    }
    iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
    std::__cxx11::string::string((string *)&local_50,"value",&local_89);
    this_00 = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var_00,iVar2),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    CVar3 = FieldDescriptor::cpp_type(this_00);
    switch(CVar3) {
    case CPPTYPE_INT32:
      value_00 = MapValueRef::GetInt32Value(&(((local_88.node_)->kv).v_)->second);
      MapValueRef::SetInt32Value(map_val,value_00);
      break;
    case CPPTYPE_INT64:
      value_03 = MapValueRef::GetInt64Value(&(((local_88.node_)->kv).v_)->second);
      MapValueRef::SetInt64Value(map_val,value_03);
      break;
    case CPPTYPE_UINT32:
      value_01 = MapValueRef::GetUInt32Value(&(((local_88.node_)->kv).v_)->second);
      MapValueRef::SetUInt32Value(map_val,value_01);
      break;
    case CPPTYPE_UINT64:
      value_02 = MapValueRef::GetUInt64Value(&(((local_88.node_)->kv).v_)->second);
      MapValueRef::SetUInt64Value(map_val,value_02);
      break;
    case CPPTYPE_DOUBLE:
      value_06 = MapValueRef::GetDoubleValue(&(((local_88.node_)->kv).v_)->second);
      MapValueRef::SetDoubleValue(map_val,value_06);
      break;
    case CPPTYPE_FLOAT:
      value_05 = MapValueRef::GetFloatValue(&(((local_88.node_)->kv).v_)->second);
      MapValueRef::SetFloatValue(map_val,value_05);
      break;
    case CPPTYPE_BOOL:
      value = MapValueRef::GetBoolValue(&(((local_88.node_)->kv).v_)->second);
      MapValueRef::SetBoolValue(map_val,value);
      break;
    case CPPTYPE_ENUM:
      iVar2 = MapValueRef::GetEnumValue(&(((local_88.node_)->kv).v_)->second);
      MapValueRef::SetEnumValue(map_val,iVar2);
      break;
    case CPPTYPE_STRING:
      value_04 = MapValueRef::GetStringValue_abi_cxx11_(&(((local_88.node_)->kv).v_)->second);
      MapValueRef::SetStringValue(map_val,value_04);
      break;
    case CPPTYPE_MESSAGE:
      pMVar4 = MapValueRef::MutableMessageValue(map_val);
      pMVar5 = MapValueRef::GetMessageValue(&(((local_88.node_)->kv).v_)->second);
      (*(pMVar4->super_MessageLite)._vptr_MessageLite[0x10])(pMVar4,pMVar5);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::operator++(&local_88);
  }
  return;
}

Assistant:

void DynamicMapField::MergeFrom(const MapFieldBase& other) {
  GOOGLE_DCHECK(IsMapValid() && other.IsMapValid());
  Map<MapKey, MapValueRef>* map = MutableMap();
  const DynamicMapField& other_field =
      reinterpret_cast<const DynamicMapField&>(other);
  for (Map<MapKey, MapValueRef>::const_iterator other_it =
           other_field.map_.begin();
       other_it != other_field.map_.end(); ++other_it) {
    Map<MapKey, MapValueRef>::iterator iter = map->find(other_it->first);
    MapValueRef* map_val;
    if (iter == map->end()) {
      map_val = &map_[other_it->first];
      AllocateMapValue(map_val);
    } else {
      map_val = &iter->second;
    }

    // Copy map value
    const FieldDescriptor* field_descriptor =
        default_entry_->GetDescriptor()->FindFieldByName("value");
    switch (field_descriptor->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        map_val->SetInt32Value(other_it->second.GetInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        map_val->SetInt64Value(other_it->second.GetInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        map_val->SetUInt32Value(other_it->second.GetUInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        map_val->SetUInt64Value(other_it->second.GetUInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_FLOAT: {
        map_val->SetFloatValue(other_it->second.GetFloatValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_DOUBLE: {
        map_val->SetDoubleValue(other_it->second.GetDoubleValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_BOOL: {
        map_val->SetBoolValue(other_it->second.GetBoolValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        map_val->SetStringValue(other_it->second.GetStringValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_ENUM: {
        map_val->SetEnumValue(other_it->second.GetEnumValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        map_val->MutableMessageValue()->CopyFrom(
            other_it->second.GetMessageValue());
        break;
      }
    }
  }
}